

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

Dar_Cut_t * Dar_ObjPrepareCuts(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Dar_Cut_t *pDVar4;
  int local_2c;
  Dar_Cut_t *pDStack_28;
  int i;
  Dar_Cut_t *pCut;
  Dar_Cut_t *pCutSet;
  Aig_Obj_t *pObj_local;
  Dar_Man_t *p_local;
  
  pDVar4 = Dar_ObjCuts(pObj);
  if (pDVar4 == (Dar_Cut_t *)0x0) {
    *(ulong *)&pObj->field_0x18 =
         *(ulong *)&pObj->field_0x18 & 0xffffffffffffff | (ulong)(uint)p->pPars->nCutsMax << 0x38;
    pDVar4 = (Dar_Cut_t *)Aig_MmFixedEntryFetch(p->pMemCuts);
    memset(pDVar4,0,(long)p->pPars->nCutsMax * 0x18);
    Dar_ObjSetCuts(pObj,pDVar4);
    pDStack_28 = Dar_ObjCuts(pObj);
    for (local_2c = 0; local_2c < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38)
        ; local_2c = local_2c + 1) {
      *(uint *)&pDStack_28->field_0x4 = *(uint *)&pDStack_28->field_0x4 & 0xefffffff;
      pDStack_28 = pDStack_28 + 1;
    }
    Vec_PtrPush(p->vCutNodes,pObj);
    *(uint *)&pDVar4->field_0x4 = *(uint *)&pDVar4->field_0x4 & 0xefffffff | 0x10000000;
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      *(uint *)&pDVar4->field_0x4 = *(uint *)&pDVar4->field_0x4 & 0x1fffffff | 0x20000000;
      pDVar4->pLeaves[0] = pObj->Id;
      uVar2 = Aig_ObjCutSign(pObj->Id);
      pDVar4->uSign = uVar2;
      *(uint *)&pDVar4->field_0x4 = *(uint *)&pDVar4->field_0x4 & 0xffff0000 | 0xaaaa;
    }
    else {
      *(uint *)&pDVar4->field_0x4 = *(uint *)&pDVar4->field_0x4 & 0x1fffffff;
      pDVar4->uSign = 0;
      *(uint *)&pDVar4->field_0x4 = *(uint *)&pDVar4->field_0x4 & 0xffff0000 | 0xffff;
    }
    uVar2 = Dar_CutFindValue(p,pDVar4);
    *(uint *)&pDVar4->field_0x4 = *(uint *)&pDVar4->field_0x4 & 0xf800ffff | (uVar2 & 0x7ff) << 0x10
    ;
    iVar1 = p->nCutMemUsed;
    iVar3 = Aig_MmFixedReadMemUsage(p->pMemCuts);
    if (iVar1 < iVar3 / 0x100000) {
      iVar1 = Aig_MmFixedReadMemUsage(p->pMemCuts);
      p->nCutMemUsed = iVar1 / 0x100000;
    }
    return pDVar4;
  }
  __assert_fail("Dar_ObjCuts(pObj) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                ,0x2a0,"Dar_Cut_t *Dar_ObjPrepareCuts(Dar_Man_t *, Aig_Obj_t *)");
}

Assistant:

Dar_Cut_t * Dar_ObjPrepareCuts( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutSet, * pCut;
    int i;
    assert( Dar_ObjCuts(pObj) == NULL );
    pObj->nCuts = p->pPars->nCutsMax;
    // create the cutset of the node
    pCutSet = (Dar_Cut_t *)Aig_MmFixedEntryFetch( p->pMemCuts );
    memset( pCutSet, 0, p->pPars->nCutsMax * sizeof(Dar_Cut_t) );
    Dar_ObjSetCuts( pObj, pCutSet );
    Dar_ObjForEachCutAll( pObj, pCut, i )
        pCut->fUsed = 0;
    Vec_PtrPush( p->vCutNodes, pObj );
    // add unit cut if needed
    pCut = pCutSet;
    pCut->fUsed = 1;
    if ( Aig_ObjIsConst1(pObj) )
    {
        pCut->nLeaves = 0;
        pCut->uSign = 0;
        pCut->uTruth = 0xFFFF;
    }
    else
    {
        pCut->nLeaves = 1;
        pCut->pLeaves[0] = pObj->Id;
        pCut->uSign = Aig_ObjCutSign( pObj->Id );
        pCut->uTruth = 0xAAAA;
    }
    pCut->Value = Dar_CutFindValue( p, pCut );
    if ( p->nCutMemUsed < Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) )
        p->nCutMemUsed = Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20);
    return pCutSet;
}